

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall libtorrent::dht::observer::set_target(observer *this,endpoint *ep)

{
  bool bVar1;
  unsigned_short uVar2;
  bytes_type bVar3;
  bytes_type bVar4;
  address local_a0;
  undefined1 local_7c [44];
  address_v6 local_50;
  undefined8 local_31;
  undefined8 local_29;
  undefined1 local_21;
  rep local_20;
  basic_endpoint<boost::asio::ip::udp> *local_18;
  endpoint *ep_local;
  observer *this_local;
  
  local_18 = ep;
  ep_local = (endpoint *)this;
  local_20 = ::std::chrono::_V2::system_clock::now();
  (this->m_sent).__d.__r = local_20;
  uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port(local_18);
  this->m_port = uVar2;
  bVar1 = libtorrent::aux::is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(local_18);
  if (bVar1) {
    local_21 = 0x20;
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
    operator|=(&this->flags,
               (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)0x20);
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
              ((address *)(local_7c + 0xc),local_18);
    boost::asio::ip::address::to_v6(&local_50,(address *)(local_7c + 0xc));
    bVar4 = boost::asio::ip::address_v6::to_bytes(&local_50);
    local_31 = bVar4._M_elems._0_8_;
    *(undefined8 *)&this->m_addr = local_31;
    local_29 = bVar4._M_elems._8_8_;
    *(undefined8 *)((long)&this->m_addr + 8) = local_29;
  }
  else {
    local_7c[0xb] =
         libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
         ::operator~(&flag_ipv6_address);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
    operator&=(&this->flags,
               (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)
               local_7c[0xb]);
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_a0,local_18);
    boost::asio::ip::address::to_v4((address *)local_7c);
    bVar3 = boost::asio::ip::address_v4::to_bytes((address_v4 *)local_7c);
    *&(this->m_addr).v4._M_elems = bVar3._M_elems;
  }
  return;
}

Assistant:

void observer::set_target(udp::endpoint const& ep)
{
	m_sent = clock_type::now();

	m_port = ep.port();
	if (aux::is_v6(ep))
	{
		flags |= flag_ipv6_address;
		m_addr.v6 = ep.address().to_v6().to_bytes();
	}
	else
	{
		flags &= ~flag_ipv6_address;
		m_addr.v4 = ep.address().to_v4().to_bytes();
	}
}